

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O1

FxExpression * ParseExpressionE(FScanner *sc,PClassActor *cls)

{
  int o;
  bool bVar1;
  FxExpression *this;
  FxExpression *r;
  int token;
  FxExpression *l;
  
  this = ParseExpressionD(sc,cls);
  bVar1 = FScanner::GetToken(sc);
  l = this;
  if (bVar1) {
    do {
      o = sc->TokenType;
      this = l;
      if (2 < o - 0x116U) break;
      r = ParseExpressionD(sc,cls);
      this = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
      FxShift::FxShift((FxShift *)this,o,l,r);
      bVar1 = FScanner::GetToken(sc);
      l = this;
    } while (bVar1);
  }
  if (sc->End == false) {
    FScanner::UnGet(sc);
  }
  return this;
}

Assistant:

static FxExpression *ParseExpressionE (FScanner &sc, PClassActor *cls)
{
	FxExpression *tmp = ParseExpressionD (sc, cls);

	while (sc.GetToken() && (sc.TokenType == TK_LShift || sc.TokenType == TK_RShift || sc.TokenType == TK_URShift))
	{
		int token = sc.TokenType;
		FxExpression *right = ParseExpressionD (sc, cls);
		tmp = new FxShift(token, tmp, right);
	}
	if (!sc.End) sc.UnGet();
	return tmp;
}